

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char *__nptr;
  int iVar24;
  int iVar25;
  uint uVar26;
  int extraout_EAX;
  size_t sVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar52;
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar74;
  undefined1 auVar72 [16];
  int iVar75;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar89;
  int iVar93;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  __u32 force_tx_stmin;
  sockaddr_can addr;
  uchar buf [67000];
  ulong uStack_10650;
  ulong uStack_10648;
  uint uStack_10640;
  uint uStack_10634;
  uint uStack_10630;
  undefined4 uStack_1062c;
  ulong uStack_10628;
  sockaddr sStack_10620;
  ulong uStack_10608;
  ulong uStack_10600;
  undefined1 auStack_105f8 [16];
  char acStack_105e8 [67000];
  long lVar55;
  
  uStack_1062c = 0;
  sStack_10620.sa_data[6] = -1;
  sStack_10620.sa_data[7] = -1;
  sStack_10620.sa_data[8] = -1;
  sStack_10620.sa_data[9] = -1;
  sStack_10620.sa_data[10] = -1;
  sStack_10620.sa_data[0xb] = -1;
  sStack_10620.sa_data[0xc] = -1;
  sStack_10620.sa_data[0xd] = -1;
  uStack_10648 = 1;
  uVar41 = 0xffffffff;
  uStack_10650 = 0xffffffff;
  uVar42 = 0;
  uStack_10628 = 0;
LAB_0010167c:
  iVar24 = getopt(argc,argv,"s:d:x:p:P:t:f:D:l:g:bSCL:?");
  uVar28 = uStack_10628;
  __nptr = _optarg;
  if (iVar24 < 0x53) {
    if (0x43 < iVar24) {
      if (iVar24 == 0x44) {
        uVar42 = strtoul(_optarg,(char **)0x0,10);
        if (((int)uVar42 == 0) || (66999 < (int)uVar42)) goto LAB_001023aa;
      }
      else if (iVar24 == 0x4c) {
        iVar24 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1050d9,0x1050da);
        if (iVar24 != 3) goto LAB_001023a2;
      }
      else {
        if (iVar24 != 0x50) goto switchD_001016a4_caseD_63;
        cVar1 = *_optarg;
        if (cVar1 == 'a') {
          main::opts.flags = main::opts.flags | 0x30;
        }
        else if (cVar1 == 'c') {
          main::opts.flags = main::opts.flags | 0x20;
        }
        else {
          if (cVar1 != 'l') goto LAB_001023c2;
          main::opts.flags = main::opts.flags | 0x10;
        }
      }
      goto LAB_0010167c;
    }
    if (iVar24 == 0x43) {
      main::opts.flags = main::opts.flags | 0x1000;
      goto LAB_0010167c;
    }
    if (iVar24 != -1) {
      if (iVar24 == 0x3f) {
        main_cold_1();
      }
      goto switchD_001016a4_caseD_63;
    }
    if ((((argc - _optind != 1) || ((int)uStack_10650 == -1)) ||
        ((main::opts.flags & 0x1800) == 0x1800)) ||
       (((main::opts.flags & 0x1800) == 0 && ((int)uVar41 == -1)))) goto LAB_001023cd;
    iVar24 = socket(0x1d,2,6);
    if (iVar24 < 0) goto LAB_001023d5;
    iVar25 = setsockopt(iVar24,0x6a,1,&main::opts,0xc);
    if (iVar25 < 0) goto LAB_001023da;
    if ((main::llopts.tx_dl != '\0') &&
       (iVar25 = setsockopt(iVar24,0x6a,5,&main::llopts,3), iVar25 < 0)) goto LAB_001023eb;
    if ((main::opts.flags & 0x80) != 0) {
      setsockopt(iVar24,0x6a,3,&uStack_1062c,4);
    }
    sStack_10620.sa_family = 0x1d;
    sStack_10620.sa_data._2_4_ = if_nametoindex(argv[_optind]);
    if (sStack_10620.sa_data._2_4_ == 0) goto LAB_001023df;
    iVar25 = bind(iVar24,&sStack_10620,0x18);
    if (-1 < iVar25) {
      iVar25 = (int)uVar42;
      if (iVar25 == 0) {
        uVar42 = 0;
        goto LAB_001022b3;
      }
      if (iVar25 < 1) {
        uVar42 = 0;
      }
      else {
        uStack_10600 = (ulong)(iVar25 + 0xfU & 0xfffffff0);
        lVar29 = (uVar42 & 0xffffffff) - 1;
        auStack_105f8._8_4_ = (int)lVar29;
        auStack_105f8._0_8_ = lVar29;
        auStack_105f8._12_4_ = (int)((ulong)lVar29 >> 0x20);
        uStack_10640 = 0xf;
        uStack_10630 = 0xe;
        uStack_10634 = 0xd;
        uVar33 = 0xc;
        uVar34 = 0xb;
        uVar35 = 10;
        uVar36 = 9;
        uVar37 = 8;
        uVar31 = 7;
        uVar40 = 6;
        uVar38 = 5;
        uVar39 = 4;
        uVar26 = 3;
        uVar32 = 2;
        uVar30 = 1;
        uVar41 = 0;
        auVar43 = auStack_105f8;
        auVar54 = _DAT_00103010;
        auVar56 = _DAT_00103020;
        auVar57 = _DAT_00103030;
        auVar58 = _DAT_00103040;
        auVar59 = _DAT_00103050;
        auVar60 = _DAT_00103060;
        auVar61 = _DAT_00103070;
        auVar62 = _DAT_00103080;
        do {
          auVar72 = auStack_105f8 ^ _DAT_00103090;
          auVar76 = auVar62 ^ _DAT_00103090;
          iVar25 = auVar72._0_4_;
          iVar89 = -(uint)(iVar25 < auVar76._0_4_);
          iVar53 = auVar72._4_4_;
          auVar78._4_4_ = -(uint)(iVar53 < auVar76._4_4_);
          iVar74 = auVar72._8_4_;
          iVar93 = -(uint)(iVar74 < auVar76._8_4_);
          iVar75 = auVar72._12_4_;
          auVar78._12_4_ = -(uint)(iVar75 < auVar76._12_4_);
          auVar72._4_4_ = iVar89;
          auVar72._0_4_ = iVar89;
          auVar72._8_4_ = iVar93;
          auVar72._12_4_ = iVar93;
          auVar72 = pshuflw(auVar43,auVar72,0xe8);
          auVar77._4_4_ = -(uint)(auVar76._4_4_ == iVar53);
          auVar77._12_4_ = -(uint)(auVar76._12_4_ == iVar75);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar63 = pshuflw(in_XMM11,auVar77,0xe8);
          auVar78._0_4_ = auVar78._4_4_;
          auVar78._8_4_ = auVar78._12_4_;
          auVar76 = pshuflw(auVar72,auVar78,0xe8);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar76 | auVar63 & auVar72) ^ auVar43;
          auVar43 = packssdw(auVar43,auVar43);
          cVar1 = (char)uVar41;
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41] = (char)((uVar41 & 0xffffffff) / 0xff) + '\x01' + cVar1;
          }
          auVar63._4_4_ = iVar89;
          auVar63._0_4_ = iVar89;
          auVar63._8_4_ = iVar93;
          auVar63._12_4_ = iVar93;
          auVar78 = auVar77 & auVar63 | auVar78;
          auVar43 = packssdw(auVar78,auVar78);
          auVar76._8_4_ = 0xffffffff;
          auVar76._0_8_ = 0xffffffffffffffff;
          auVar76._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar76,auVar43 ^ auVar76);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._0_4_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 1] = (char)(uVar30 / 0xff) + '\x02' + cVar1;
          }
          auVar43 = auVar61 ^ _DAT_00103090;
          auVar64._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar64._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar64._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar64._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar79._4_4_ = auVar64._0_4_;
          auVar79._0_4_ = auVar64._0_4_;
          auVar79._8_4_ = auVar64._8_4_;
          auVar79._12_4_ = auVar64._8_4_;
          iVar89 = -(uint)(auVar43._4_4_ == iVar53);
          iVar93 = -(uint)(auVar43._12_4_ == iVar75);
          auVar11._4_4_ = iVar89;
          auVar11._0_4_ = iVar89;
          auVar11._8_4_ = iVar93;
          auVar11._12_4_ = iVar93;
          auVar90._4_4_ = auVar64._4_4_;
          auVar90._0_4_ = auVar64._4_4_;
          auVar90._8_4_ = auVar64._12_4_;
          auVar90._12_4_ = auVar64._12_4_;
          auVar43 = auVar11 & auVar79 | auVar90;
          auVar43 = packssdw(auVar43,auVar43);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar2,auVar43 ^ auVar2);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
            acStack_105e8[uVar41 + 2] = (char)(uVar32 / 0xff) + '\x03' + cVar1;
          }
          auVar43 = pshufhw(auVar43,auVar79,0x84);
          auVar12._4_4_ = iVar89;
          auVar12._0_4_ = iVar89;
          auVar12._8_4_ = iVar93;
          auVar12._12_4_ = iVar93;
          auVar76 = pshufhw(auVar64,auVar12,0x84);
          auVar72 = pshufhw(auVar43,auVar90,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar72 | auVar76 & auVar43) ^ auVar44;
          auVar43 = packssdw(auVar44,auVar44);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._0_4_ >> 0x18 & 1) != 0) {
            acStack_105e8[uVar41 + 3] = (char)(uVar26 / 0xff) + '\x04' + cVar1;
          }
          auVar43 = auVar60 ^ _DAT_00103090;
          auVar65._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar65._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar65._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar65._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar13._4_4_ = auVar65._0_4_;
          auVar13._0_4_ = auVar65._0_4_;
          auVar13._8_4_ = auVar65._8_4_;
          auVar13._12_4_ = auVar65._8_4_;
          auVar76 = pshuflw(auVar90,auVar13,0xe8);
          auVar45._0_4_ = -(uint)(auVar43._0_4_ == iVar25);
          auVar45._4_4_ = -(uint)(auVar43._4_4_ == iVar53);
          auVar45._8_4_ = -(uint)(auVar43._8_4_ == iVar74);
          auVar45._12_4_ = -(uint)(auVar43._12_4_ == iVar75);
          auVar80._4_4_ = auVar45._4_4_;
          auVar80._0_4_ = auVar45._4_4_;
          auVar80._8_4_ = auVar45._12_4_;
          auVar80._12_4_ = auVar45._12_4_;
          auVar43 = pshuflw(auVar45,auVar80,0xe8);
          auVar81._4_4_ = auVar65._4_4_;
          auVar81._0_4_ = auVar65._4_4_;
          auVar81._8_4_ = auVar65._12_4_;
          auVar81._12_4_ = auVar65._12_4_;
          auVar72 = pshuflw(auVar65,auVar81,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 & auVar76,(auVar72 | auVar43 & auVar76) ^ auVar3);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 4] = (char)(uVar39 / 0xff) + '\x05' + cVar1;
          }
          auVar14._4_4_ = auVar65._0_4_;
          auVar14._0_4_ = auVar65._0_4_;
          auVar14._8_4_ = auVar65._8_4_;
          auVar14._12_4_ = auVar65._8_4_;
          auVar81 = auVar80 & auVar14 | auVar81;
          auVar72 = packssdw(auVar81,auVar81);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43,auVar72 ^ auVar4);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._4_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 5] = (char)(uVar38 / 0xff) + '\x06' + cVar1;
          }
          auVar43 = auVar59 ^ _DAT_00103090;
          auVar66._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar66._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar66._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar66._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar82._4_4_ = auVar66._0_4_;
          auVar82._0_4_ = auVar66._0_4_;
          auVar82._8_4_ = auVar66._8_4_;
          auVar82._12_4_ = auVar66._8_4_;
          iVar89 = -(uint)(auVar43._4_4_ == iVar53);
          iVar93 = -(uint)(auVar43._12_4_ == iVar75);
          auVar15._4_4_ = iVar89;
          auVar15._0_4_ = iVar89;
          auVar15._8_4_ = iVar93;
          auVar15._12_4_ = iVar93;
          auVar91._4_4_ = auVar66._4_4_;
          auVar91._0_4_ = auVar66._4_4_;
          auVar91._8_4_ = auVar66._12_4_;
          auVar91._12_4_ = auVar66._12_4_;
          auVar43 = auVar15 & auVar82 | auVar91;
          auVar43 = packssdw(auVar43,auVar43);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar5,auVar43 ^ auVar5);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 6] = (char)(uVar40 / 0xff) + '\a' + cVar1;
          }
          auVar43 = pshufhw(auVar43,auVar82,0x84);
          auVar16._4_4_ = iVar89;
          auVar16._0_4_ = iVar89;
          auVar16._8_4_ = iVar93;
          auVar16._12_4_ = iVar93;
          auVar76 = pshufhw(auVar66,auVar16,0x84);
          auVar72 = pshufhw(auVar43,auVar91,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar72 | auVar76 & auVar43) ^ auVar46;
          auVar43 = packssdw(auVar46,auVar46);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._6_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 7] = (char)(uVar31 / 0xff) + '\b' + cVar1;
          }
          auVar43 = auVar58 ^ _DAT_00103090;
          auVar67._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar67._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar67._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar67._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar17._4_4_ = auVar67._0_4_;
          auVar17._0_4_ = auVar67._0_4_;
          auVar17._8_4_ = auVar67._8_4_;
          auVar17._12_4_ = auVar67._8_4_;
          auVar76 = pshuflw(auVar91,auVar17,0xe8);
          auVar47._0_4_ = -(uint)(auVar43._0_4_ == iVar25);
          auVar47._4_4_ = -(uint)(auVar43._4_4_ == iVar53);
          auVar47._8_4_ = -(uint)(auVar43._8_4_ == iVar74);
          auVar47._12_4_ = -(uint)(auVar43._12_4_ == iVar75);
          auVar83._4_4_ = auVar47._4_4_;
          auVar83._0_4_ = auVar47._4_4_;
          auVar83._8_4_ = auVar47._12_4_;
          auVar83._12_4_ = auVar47._12_4_;
          auVar43 = pshuflw(auVar47,auVar83,0xe8);
          auVar84._4_4_ = auVar67._4_4_;
          auVar84._0_4_ = auVar67._4_4_;
          auVar84._8_4_ = auVar67._12_4_;
          auVar84._12_4_ = auVar67._12_4_;
          auVar72 = pshuflw(auVar67,auVar84,0xe8);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar68 = (auVar72 | auVar43 & auVar76) ^ auVar68;
          auVar72 = packssdw(auVar68,auVar68);
          auVar43 = packsswb(auVar43 & auVar76,auVar72);
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 8] = (char)(uVar37 / 0xff) + '\t' + cVar1;
          }
          auVar18._4_4_ = auVar67._0_4_;
          auVar18._0_4_ = auVar67._0_4_;
          auVar18._8_4_ = auVar67._8_4_;
          auVar18._12_4_ = auVar67._8_4_;
          auVar84 = auVar83 & auVar18 | auVar84;
          auVar72 = packssdw(auVar84,auVar84);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar72 = packssdw(auVar72 ^ auVar6,auVar72 ^ auVar6);
          auVar43 = packsswb(auVar43,auVar72);
          if ((auVar43._8_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 9] = (char)(uVar36 / 0xff) + '\n' + cVar1;
          }
          auVar43 = auVar57 ^ _DAT_00103090;
          auVar69._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar69._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar69._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar69._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar85._4_4_ = auVar69._0_4_;
          auVar85._0_4_ = auVar69._0_4_;
          auVar85._8_4_ = auVar69._8_4_;
          auVar85._12_4_ = auVar69._8_4_;
          iVar89 = -(uint)(auVar43._4_4_ == iVar53);
          iVar93 = -(uint)(auVar43._12_4_ == iVar75);
          auVar19._4_4_ = iVar89;
          auVar19._0_4_ = iVar89;
          auVar19._8_4_ = iVar93;
          auVar19._12_4_ = iVar93;
          auVar92._4_4_ = auVar69._4_4_;
          auVar92._0_4_ = auVar69._4_4_;
          auVar92._8_4_ = auVar69._12_4_;
          auVar92._12_4_ = auVar69._12_4_;
          auVar43 = auVar19 & auVar85 | auVar92;
          auVar43 = packssdw(auVar43,auVar43);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar7,auVar43 ^ auVar7);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 10] = (char)(uVar35 / 0xff) + '\v' + cVar1;
          }
          auVar43 = pshufhw(auVar43,auVar85,0x84);
          auVar20._4_4_ = iVar89;
          auVar20._0_4_ = iVar89;
          auVar20._8_4_ = iVar93;
          auVar20._12_4_ = iVar93;
          auVar76 = pshufhw(auVar69,auVar20,0x84);
          auVar72 = pshufhw(auVar43,auVar92,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar72 | auVar76 & auVar43) ^ auVar48;
          auVar43 = packssdw(auVar48,auVar48);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._10_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 0xb] = (char)(uVar34 / 0xff) + '\f' + cVar1;
          }
          auVar43 = auVar56 ^ _DAT_00103090;
          auVar70._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar70._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar70._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar70._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar21._4_4_ = auVar70._0_4_;
          auVar21._0_4_ = auVar70._0_4_;
          auVar21._8_4_ = auVar70._8_4_;
          auVar21._12_4_ = auVar70._8_4_;
          auVar76 = pshuflw(auVar92,auVar21,0xe8);
          auVar49._0_4_ = -(uint)(auVar43._0_4_ == iVar25);
          auVar49._4_4_ = -(uint)(auVar43._4_4_ == iVar53);
          auVar49._8_4_ = -(uint)(auVar43._8_4_ == iVar74);
          auVar49._12_4_ = -(uint)(auVar43._12_4_ == iVar75);
          auVar86._4_4_ = auVar49._4_4_;
          auVar86._0_4_ = auVar49._4_4_;
          auVar86._8_4_ = auVar49._12_4_;
          auVar86._12_4_ = auVar49._12_4_;
          auVar43 = pshuflw(auVar49,auVar86,0xe8);
          auVar87._4_4_ = auVar70._4_4_;
          auVar87._0_4_ = auVar70._4_4_;
          auVar87._8_4_ = auVar70._12_4_;
          auVar87._12_4_ = auVar70._12_4_;
          auVar72 = pshuflw(auVar70,auVar87,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 & auVar76,(auVar72 | auVar43 & auVar76) ^ auVar8);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 0xc] = (char)(uVar33 / 0xff) + '\r' + cVar1;
          }
          auVar22._4_4_ = auVar70._0_4_;
          auVar22._0_4_ = auVar70._0_4_;
          auVar22._8_4_ = auVar70._8_4_;
          auVar22._12_4_ = auVar70._8_4_;
          auVar87 = auVar86 & auVar22 | auVar87;
          auVar72 = packssdw(auVar87,auVar87);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43,auVar72 ^ auVar9);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._12_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 0xd] = (char)(uStack_10634 / 0xff) + '\x0e' + cVar1;
          }
          auVar43 = auVar54 ^ _DAT_00103090;
          auVar71._0_4_ = -(uint)(iVar25 < auVar43._0_4_);
          auVar71._4_4_ = -(uint)(iVar53 < auVar43._4_4_);
          auVar71._8_4_ = -(uint)(iVar74 < auVar43._8_4_);
          auVar71._12_4_ = -(uint)(iVar75 < auVar43._12_4_);
          auVar88._4_4_ = auVar71._0_4_;
          auVar88._0_4_ = auVar71._0_4_;
          auVar88._8_4_ = auVar71._8_4_;
          auVar88._12_4_ = auVar71._8_4_;
          iVar25 = -(uint)(auVar43._4_4_ == iVar53);
          iVar53 = -(uint)(auVar43._12_4_ == iVar75);
          auVar73._4_4_ = iVar25;
          auVar73._0_4_ = iVar25;
          auVar73._8_4_ = iVar53;
          auVar73._12_4_ = iVar53;
          auVar50._4_4_ = auVar71._4_4_;
          auVar50._0_4_ = auVar71._4_4_;
          auVar50._8_4_ = auVar71._12_4_;
          auVar50._12_4_ = auVar71._12_4_;
          auVar50 = auVar73 & auVar88 | auVar50;
          auVar43 = packssdw(auVar50,auVar50);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar10,auVar43 ^ auVar10);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_105e8[uVar41 + 0xe] = (char)(uStack_10630 / 0xff) + '\x0f' + cVar1;
          }
          auVar43 = pshufhw(auVar43,auVar88,0x84);
          in_XMM11 = pshufhw(auVar71,auVar73,0x84);
          in_XMM11 = in_XMM11 & auVar43;
          auVar23._4_4_ = auVar71._4_4_;
          auVar23._0_4_ = auVar71._4_4_;
          auVar23._8_4_ = auVar71._12_4_;
          auVar23._12_4_ = auVar71._12_4_;
          auVar43 = pshufhw(auVar43,auVar23,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar43 | in_XMM11) ^ auVar51;
          auVar43 = packssdw(auVar51,auVar51);
          auVar43 = packsswb(auVar43,auVar43);
          if ((auVar43._14_2_ >> 8 & 1) != 0) {
            acStack_105e8[uVar41 + 0xf] = (char)(uStack_10640 / 0xff) + '\x10' + cVar1;
          }
          uVar41 = uVar41 + 0x10;
          lVar29 = (long)DAT_001030a0;
          lVar55 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + lVar29;
          lVar52 = DAT_001030a0._8_8_;
          auVar62._8_8_ = lVar55 + lVar52;
          lVar55 = auVar61._8_8_;
          auVar61._0_8_ = auVar61._0_8_ + lVar29;
          auVar61._8_8_ = lVar55 + lVar52;
          lVar55 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + lVar29;
          auVar60._8_8_ = lVar55 + lVar52;
          lVar55 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + lVar29;
          auVar59._8_8_ = lVar55 + lVar52;
          lVar55 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar29;
          auVar58._8_8_ = lVar55 + lVar52;
          lVar55 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar29;
          auVar57._8_8_ = lVar55 + lVar52;
          lVar55 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + lVar29;
          auVar56._8_8_ = lVar55 + lVar52;
          lVar55 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + lVar29;
          auVar54._8_8_ = lVar55 + lVar52;
          uStack_10640 = uStack_10640 + 0x10;
          uStack_10630 = uStack_10630 + 0x10;
          uStack_10634 = uStack_10634 + 0x10;
          uVar33 = uVar33 + 0x10;
          uVar34 = uVar34 + 0x10;
          uVar35 = uVar35 + 0x10;
          uVar36 = uVar36 + 0x10;
          uVar37 = uVar37 + 0x10;
          uVar31 = uVar31 + 0x10;
          uVar40 = uVar40 + 0x10;
          uVar38 = uVar38 + 0x10;
          uVar39 = uVar39 + 0x10;
          uVar26 = uVar26 + 0x10;
          uVar32 = uVar32 + 0x10;
          uVar30 = uVar30 + 0x10;
          uVar28 = uStack_10628;
          auVar43 = _DAT_001030a0;
          uStack_10608 = uVar42;
        } while (uStack_10600 != uVar41);
      }
      goto LAB_001022e6;
    }
  }
  else {
    switch(iVar24) {
    case 0x62:
      main::opts.flags = main::opts.flags | 0x400;
      goto LAB_0010167c;
    case 99:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_001016a4_caseD_63:
      main_cold_14();
LAB_001023a2:
      main_cold_2();
LAB_001023aa:
      main_cold_4();
LAB_001023b2:
      main_cold_7();
      break;
    case 100:
      uVar41 = strtoul(_optarg,(char **)0x0,0x10);
      sStack_10620.sa_data._6_4_ = (uint)uVar41;
      sVar27 = strlen(_optarg);
      if (7 < sVar27) {
        sStack_10620.sa_data._6_4_ = (uint)uVar41 | 0x80000000;
        uVar41 = (ulong)(uint)sStack_10620.sa_data._6_4_;
      }
      goto LAB_0010167c;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x80;
      uVar28 = strtoul(_optarg,(char **)0x0,10);
      uStack_1062c = (undefined4)uVar28;
      goto LAB_0010167c;
    case 0x67:
      uStack_10628 = strtoul(_optarg,(char **)0x0,10);
      goto LAB_0010167c;
    case 0x6c:
      goto switchD_001016a4_caseD_6c;
    case 0x70:
      iVar24 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1050d5,0x1050d6);
      if (iVar24 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
        goto LAB_0010167c;
      }
      if (iVar24 == 1) {
        main::opts.flags = main::opts.flags | 4;
        goto LAB_0010167c;
      }
      iVar24 = __isoc99_sscanf(_optarg,":%hhx",0x1050d6);
      if (iVar24 == 1) {
        main::opts.flags = main::opts.flags | 8;
        goto LAB_0010167c;
      }
      break;
    case 0x73:
      uStack_10650 = strtoul(_optarg,(char **)0x0,0x10);
      sStack_10620.sa_data._10_4_ = (uint)uStack_10650;
      sVar27 = strlen(_optarg);
      if (7 < sVar27) {
        sStack_10620.sa_data._10_4_ = (uint)uStack_10650 | 0x80000000;
        uStack_10650 = (ulong)(uint)sStack_10620.sa_data._10_4_;
      }
      goto LAB_0010167c;
    case 0x74:
      iVar24 = strncmp(_optarg,"ZERO",4);
      if (iVar24 == 0) {
        main::opts.frame_txtime = 0xffffffff;
      }
      else {
        uVar28 = strtoul(__nptr,(char **)0x0,10);
        main::opts.frame_txtime = (__u32)uVar28;
      }
      goto LAB_0010167c;
    default:
      if (iVar24 == 0x53) {
        main::opts.flags = main::opts.flags | 0x800;
      }
      else {
        if (iVar24 != 0x78) goto switchD_001016a4_caseD_63;
        iVar24 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1050d4,0x1050d7);
        uVar26 = 2;
        if (iVar24 != 1) {
          if (iVar24 != 2) goto LAB_001023b2;
          uVar26 = 0x202;
        }
        main::opts.flags = main::opts.flags | uVar26;
      }
      goto LAB_0010167c;
    }
    main_cold_6();
LAB_001023c2:
    main_cold_5();
LAB_001023cd:
    main_cold_13();
LAB_001023d5:
    main_cold_12();
LAB_001023da:
    main_cold_11();
LAB_001023df:
    main_cold_10();
  }
  main_cold_9();
LAB_001023eb:
  main_cold_8();
  return extraout_EAX;
switchD_001016a4_caseD_6c:
  uStack_10648 = 0;
  if ((*_optarg != 'i') && (uStack_10648 = strtoul(_optarg,(char **)0x0,10), (int)uStack_10648 == 0)
     ) {
    main_cold_3();
    return 1;
  }
  goto LAB_0010167c;
  while (uVar42 = uVar42 + 1, uVar42 != 67000) {
LAB_001022b3:
    iVar25 = __isoc99_scanf("%hhx",acStack_105e8 + uVar42);
    if (iVar25 != 1) goto LAB_001022e6;
  }
  uVar42 = 67000;
LAB_001022e6:
  do {
    if ((__useconds_t)uVar28 != 0) {
      usleep((__useconds_t)uVar28);
    }
    uVar41 = write(iVar24,acStack_105e8,uVar42 & 0xffffffff);
    iVar25 = (int)uVar41;
    if (iVar25 < 0) {
      perror("write");
      return iVar25;
    }
    if ((int)uVar42 != iVar25) {
      fprintf(_stderr,"wrote only %d from %d byte\n",uVar41 & 0xffffffff,uVar42 & 0xffffffff);
    }
    iVar25 = (int)uStack_10648;
    uStack_10648 = 0;
    uVar28 = uStack_10628;
  } while ((iVar25 == 0) || (uVar26 = iVar25 - 1, uStack_10648 = (ulong)uVar26, uVar26 != 0));
  close(iVar24);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_ll_options llopts;
    int opt;
    extern int optind, opterr, optopt;
    unsigned int loops = 1; /* one (== no) loop by default */
    useconds_t usecs = 0; /* wait before sending the PDU */
    __u32 force_tx_stmin = 0;
    unsigned char buf[BUFSIZE];
    int buflen = 0;
    int datalen = 0;
    int retval = 0;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:t:f:D:l:g:bSCL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 't':
		    if (!strncmp(optarg, ZERO_STRING, strlen(ZERO_STRING)))
			    opts.frame_txtime = CAN_ISOTP_FRAME_TXTIME_ZERO;
		    else
			    opts.frame_txtime = strtoul(optarg, NULL, 10);
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_TXSTMIN;
		    force_tx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'D':
		    datalen = strtoul(optarg, NULL, 10);
		    if (!datalen || datalen >= BUFSIZE) {
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'l':
		    if (optarg[0] == 'i') {
			    loops = 0; /* infinite loop */
		    } else {
			    loops = strtoul(optarg, NULL, 10);
			    if (!loops) {
				    fprintf(stderr, "Invalid argument for option -l!\n");
				    return 1;
			    }
		    }
		    break;

	    case 'g':
		    usecs = strtoul(optarg, NULL, 10);
		    break;

	    case 'b':
		    opts.flags |= CAN_ISOTP_WAIT_TX_DONE;
		    break;

	    case 'S':
		    opts.flags |= CAN_ISOTP_SF_BROADCAST;
		    break;

	    case 'C':
		    opts.flags |= CAN_ISOTP_CF_BROADCAST;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

#define BC_FLAGS (CAN_ISOTP_SF_BROADCAST | CAN_ISOTP_CF_BROADCAST)

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	((opts.flags & BC_FLAGS) == BC_FLAGS) ||
	((addr.can_addr.tp.rx_id == NO_CAN_ID) &&
	 (!(opts.flags & BC_FLAGS)))) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }

    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts)) < 0) {
	perror("sockopt");
	exit(1);
    }


    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_TXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_TX_STMIN, &force_tx_stmin, sizeof(force_tx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    if (!datalen) {
	    while (buflen < BUFSIZE && scanf("%hhx", &buf[buflen]) == 1)
		    buflen++;
    } else {
	    for (buflen = 0; buflen < datalen; buflen++)
		    buf[buflen] = ((buflen % 0xFF) + 1) & 0xFF;
    }

loop:
    if (usecs)
	    usleep(usecs);

    retval = write(s, buf, buflen);
    if (retval < 0) {
	    perror("write");
	    return retval;
    }

    if (retval != buflen)
	    fprintf(stderr, "wrote only %d from %d byte\n", retval, buflen);

    if (loops) {
	    if (--loops)
		    goto loop;
    } else {
	    goto loop;
    }

    /* 
     * due to a Kernel internal wait queue the PDU is sent completely
     * before close() returns.
     */
    close(s);

    return 0;
}